

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::DefParamAssignmentSyntax::setChild
          (DefParamAssignmentSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  logic_error *this_00;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (index == 1) {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_d8._M_dataplus._M_p =
           (pointer)SyntaxNode::as<slang::syntax::EqualsValueClauseSyntax>(pSVar1);
    }
    not_null<slang::syntax::EqualsValueClauseSyntax*>::
    not_null<slang::syntax::EqualsValueClauseSyntax*,void>
              ((not_null<slang::syntax::EqualsValueClauseSyntax*> *)&local_b8,
               (EqualsValueClauseSyntax **)&local_d8);
    (this->setter).ptr = (EqualsValueClauseSyntax *)local_b8._M_dataplus._M_p;
  }
  else {
    if (index != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O2/extern/slang/source/AllSyntax.cpp"
                 ,&local_d9);
      std::operator+(&local_58,&local_78,":");
      std::__cxx11::to_string(&local_98,0xe92);
      std::operator+(&local_38,&local_58,&local_98);
      std::operator+(&local_d8,&local_38,": ");
      std::operator+(&local_b8,&local_d8,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_b8);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      local_d8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      pSVar1 = TokenOrSyntax::node(&child);
      local_d8._M_dataplus._M_p = (pointer)SyntaxNode::as<slang::syntax::NameSyntax>(pSVar1);
    }
    not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
              ((not_null<slang::syntax::NameSyntax*> *)&local_b8,(NameSyntax **)&local_d8);
    (this->name).ptr = (NameSyntax *)local_b8._M_dataplus._M_p;
  }
  return;
}

Assistant:

void DefParamAssignmentSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: name = child.node() ? &child.node()->as<NameSyntax>() : nullptr; return;
        case 1: setter = child.node() ? &child.node()->as<EqualsValueClauseSyntax>() : nullptr; return;
        default: ASSUME_UNREACHABLE;
    }
}